

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O2

int nghttp2_hd_deflate_change_table_size
              (nghttp2_hd_deflater *deflater,size_t settings_max_dynamic_table_size)

{
  ulong uVar1;
  
  uVar1 = deflater->min_hd_table_bufsize_max;
  if (deflater->deflate_hd_table_bufsize_max < settings_max_dynamic_table_size) {
    settings_max_dynamic_table_size = deflater->deflate_hd_table_bufsize_max;
  }
  (deflater->ctx).hd_table_bufsize_max = settings_max_dynamic_table_size;
  if (uVar1 < settings_max_dynamic_table_size) {
    settings_max_dynamic_table_size = uVar1;
  }
  deflater->min_hd_table_bufsize_max = settings_max_dynamic_table_size;
  deflater->notify_table_size_change = '\x01';
  hd_context_shrink_table_size(&deflater->ctx,&deflater->map);
  return 0;
}

Assistant:

int nghttp2_hd_deflate_change_table_size(
    nghttp2_hd_deflater *deflater, size_t settings_max_dynamic_table_size) {
  size_t next_bufsize = nghttp2_min(settings_max_dynamic_table_size,
                                    deflater->deflate_hd_table_bufsize_max);

  deflater->ctx.hd_table_bufsize_max = next_bufsize;

  deflater->min_hd_table_bufsize_max =
      nghttp2_min(deflater->min_hd_table_bufsize_max, next_bufsize);

  deflater->notify_table_size_change = 1;

  hd_context_shrink_table_size(&deflater->ctx, &deflater->map);
  return 0;
}